

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadPackedSymbols(HTreeGroup *group,VP8LBitReader *br,uint32_t *dst)

{
  undefined8 uVar1;
  uint32_t uVar2;
  int *in_RDX;
  VP8LBitReader *in_RSI;
  long in_RDI;
  HuffmanCode32 code;
  uint32_t val;
  int local_2c;
  int iStack_28;
  int local_4;
  
  uVar2 = VP8LPrefetchBits(in_RSI);
  uVar1 = *(undefined8 *)(in_RDI + 0x38 + (ulong)(uVar2 & 0x3f) * 8);
  local_2c = (int)uVar1;
  iStack_28 = (int)((ulong)uVar1 >> 0x20);
  if (local_2c < 0x100) {
    VP8LSetBitPos(in_RSI,in_RSI->bit_pos_ + local_2c);
    *in_RDX = iStack_28;
    local_4 = 0;
  }
  else {
    VP8LSetBitPos(in_RSI,in_RSI->bit_pos_ + local_2c + -0x100);
    local_4 = iStack_28;
  }
  return local_4;
}

Assistant:

static WEBP_INLINE int ReadPackedSymbols(const HTreeGroup* group,
                                         VP8LBitReader* const br,
                                         uint32_t* const dst) {
  const uint32_t val = VP8LPrefetchBits(br) & (HUFFMAN_PACKED_TABLE_SIZE - 1);
  const HuffmanCode32 code = group->packed_table[val];
  assert(group->use_packed_table);
  if (code.bits < BITS_SPECIAL_MARKER) {
    VP8LSetBitPos(br, br->bit_pos_ + code.bits);
    *dst = code.value;
    return PACKED_NON_LITERAL_CODE;
  } else {
    VP8LSetBitPos(br, br->bit_pos_ + code.bits - BITS_SPECIAL_MARKER);
    assert(code.value >= NUM_LITERAL_CODES);
    return code.value;
  }
}